

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmdate.cpp
# Opt level: O2

void __thiscall
date_parse_result::utc_to_local(date_parse_result *this,int32_t *dayno,int32_t *daytime)

{
  int32_t ofs;
  
  *daytime = *daytime + this->tzofs;
  caldate_t::normalize(dayno,daytime);
  return;
}

Assistant:

int has_tzofs() const { return tzofs != INT_MIN; }